

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.h
# Opt level: O2

void __thiscall
Perseus::
PlanStartOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
          (Perseus *this,int iter,vector<double,_std::allocator<double>_> *VB,
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          *V)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  JointBeliefInterface *pJVar3;
  ostream *poVar4;
  uint uVar5;
  PlanningUnit *pu;
  PlanningUnitMADPDiscrete *this_00;
  double dVar6;
  undefined1 in_XMM2 [16];
  string local_200;
  double local_1e0;
  string resultsDir;
  stringstream valueFunctionFilename;
  ostream local_1a8 [376];
  
  pdVar1 = (VB->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  local_1e0 = 0.0;
  for (uVar5 = 0;
      (long)(VB->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3 != (ulong)uVar5; uVar5 = uVar5 + 1
      ) {
    local_1e0 = local_1e0 + pdVar1[uVar5];
  }
  this_00 = *(PlanningUnitMADPDiscrete **)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               ((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
  }
  pJVar3 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(this_00);
  if (this->_m_verbose < -1) {
    if (pJVar3 == (JointBeliefInterface *)0x0) goto LAB_00433d0f;
  }
  else {
    std::__cxx11::string::string
              ((string *)&valueFunctionFilename,(string *)&this->_m_identification);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&valueFunctionFilename);
    poVar4 = std::operator<<(poVar4,": iteration ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 6;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iter);
    poVar4 = std::operator<<(poVar4," |V| ");
    GetSize(this,V);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," sumV/nrB ");
    auVar2 = vcvtusi2sd_avx512f(in_XMM2,(long)(VB->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)(VB->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data._M_start >> 3);
    poVar4 = std::ostream::_M_insert<double>(local_1e0 / auVar2._0_8_);
    std::operator<<(poVar4," V0 ");
    dVar6 = BeliefValue::GetValue
                      ((BeliefInterface *)(&pJVar3->field_0x0 + *(long *)((long)*pJVar3 + -0xb8)),V)
    ;
    poVar4 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar4," (best ");
    poVar4 = std::ostream::_M_insert<double>(this->_m_bestValue);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&valueFunctionFilename);
  }
  (**(code **)((long)*pJVar3 + 8))(pJVar3);
LAB_00433d0f:
  if ((this->_m_storeIntermediateValueFunctions == true) && (this->_m_dryrun == false)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&valueFunctionFilename,"POMDP",(allocator<char> *)&local_200);
    pu = *(PlanningUnit **)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
    if (pu == (PlanningUnit *)0x0) {
      pu = *(PlanningUnit **)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
    }
    directories::MADPGetResultsDir(&resultsDir,(string *)&valueFunctionFilename,pu);
    std::__cxx11::string::~string((string *)&valueFunctionFilename);
    std::__cxx11::stringstream::stringstream((stringstream *)&valueFunctionFilename);
    poVar4 = std::operator<<(local_1a8,(string *)&resultsDir);
    poVar4 = std::operator<<(poVar4,"/intermediate/");
    std::__cxx11::string::string((string *)&local_200,(string *)&this->_m_identification);
    poVar4 = std::operator<<(poVar4,(string *)&local_200);
    poVar4 = std::operator<<(poVar4,"ValueFunction_h");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"_iter_");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
    poVar4 = std::operator<<(poVar4,0x30);
    std::ostream::operator<<((ostream *)poVar4,iter);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::stringbuf::str();
    AlphaVectorPlanning::ExportValueFunction(&local_200,V,true);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::stringstream::~stringstream((stringstream *)&valueFunctionFilename);
    std::__cxx11::string::~string((string *)&resultsDir);
  }
  return;
}

Assistant:

void PlanStartOfIteration(int iter,
                              const std::vector<double> &VB,
                              const VF &V) const
        {
            double x=0;
            for(unsigned int i=0;i!=VB.size();i++)
                x+=VB[i];
            JointBeliefInterface* jb0 = GetPU()->GetNewJointBeliefFromISD();
            if(GetVerbose() >= -1)
                std::cout 
                    << GetIdentification() << ": iteration " << std::setw(6)
                    << iter 
                    << " |V| " << GetSize(V)
                    << " sumV/nrB " << x/VB.size() << " V0 " 
                    << BeliefValue::GetValue( *jb0, V)
                    << " (best " << _m_bestValue << ")" << std::endl;
            delete jb0;

            if(_m_storeIntermediateValueFunctions && !_m_dryrun)
            {
                std::string resultsDir=directories::MADPGetResultsDir("POMDP",
                                                                 GetPU());
                std::stringstream valueFunctionFilename;
                valueFunctionFilename << resultsDir << "/intermediate/"
                                      << GetIdentification()
                                      << "ValueFunction_h"
                                      << GetPU()->GetHorizon() << "_iter_" 
                                      << std::setw(4) << std::setfill('0')
                                      << iter;
                AlphaVectorPlanning::
                    ExportValueFunction(valueFunctionFilename.str(),V);
            }
        }